

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_cmp(mp_int *a,mp_int *b)

{
  int iVar1;
  
  iVar1 = a->sign;
  if (iVar1 != b->sign) {
    return (uint)(iVar1 != 1) * 2 + -1;
  }
  if (iVar1 == 1) {
    iVar1 = mp_cmp_mag(b,a);
    return iVar1;
  }
  iVar1 = mp_cmp_mag(a,b);
  return iVar1;
}

Assistant:

int mp_cmp (mp_int * a, mp_int * b)
{
  /* compare based on sign */
  if (a->sign != b->sign) {
     if (a->sign == MP_NEG) {
        return MP_LT;
     } else {
        return MP_GT;
     }
  }
  
  /* compare digits */
  if (a->sign == MP_NEG) {
     /* if negative compare opposite direction */
     return mp_cmp_mag(b, a);
  } else {
     return mp_cmp_mag(a, b);
  }
}